

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

hash_t JsUtil::
       BaseDictionary<UnifiedRegex::RegexKey,_JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruDictionaryData,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       ::GetHashCodeWithKey<UnifiedRegex::RegexKey>(RegexKey *key)

{
  hash_t hVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  InternalString local_20;
  
  Js::InternalString::InternalString(&local_20,(key->source).ptr,key->length,'\0');
  if ((ulong)local_20.m_charLength == 0) {
    hVar1 = 0x2393b8b;
  }
  else {
    uVar3 = 0x811c9dc5;
    uVar2 = 0;
    do {
      uVar4 = *(ushort *)
               ((long)local_20.m_content.ptr + uVar2 * 2 + (ulong)((uint)local_20.m_offset * 2)) ^
              uVar3;
      uVar3 = uVar4 * 0x1000193;
      uVar2 = uVar2 + 1;
    } while (local_20.m_charLength != uVar2);
    hVar1 = uVar4 * 0x2000326 + 1;
  }
  return hVar1;
}

Assistant:

static hash_t GetHashCodeWithKey(const TLookup& key)
        {
            // set last bit to 1 to avoid false positive to make hash appears to be a valid recycler address.
            // In the same line, 0 should be use to indicate a non-existing entry.
            return TAGHASH(Comparer<TLookup>::GetHashCode(key));
        }